

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ArenaImpl::Init(ArenaImpl *this)

{
  Block *b;
  long lVar1;
  LifecycleId *owner;
  SerialArena *pSVar2;
  
  LOCK();
  UNLOCK();
  lVar1 = lifecycle_id_generator_ + 1;
  this->lifecycle_id_ = lifecycle_id_generator_;
  lifecycle_id_generator_ = lVar1;
  (this->hint_)._M_b._M_p = (__pointer_type)0x0;
  (this->threads_)._M_b._M_p = (__pointer_type)0x0;
  if (this->initial_block_ == (Block *)0x0) {
    (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = 0;
  }
  else {
    Block::Block(this->initial_block_,(this->options_).initial_block_size,(Block *)0x0);
    b = this->initial_block_;
    owner = (LifecycleId *)__tls_get_addr(&PTR_0019edb8);
    pSVar2 = SerialArena::New(b,owner,this);
    pSVar2->next_ = (SerialArena *)0x0;
    (this->threads_)._M_b._M_p = pSVar2;
    (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (this->options_).initial_block_size;
    owner[1] = (LifecycleId)pSVar2;
    *owner = this->lifecycle_id_;
    (this->hint_)._M_b._M_p = pSVar2;
  }
  return;
}

Assistant:

void ArenaImpl::Init() {
  lifecycle_id_ =
      lifecycle_id_generator_.fetch_add(1, std::memory_order_relaxed);
  hint_.store(nullptr, std::memory_order_relaxed);
  threads_.store(nullptr, std::memory_order_relaxed);

  if (initial_block_) {
    // Thread which calls Init() owns the first block. This allows the
    // single-threaded case to allocate on the first block without having to
    // perform atomic operations.
    new (initial_block_) Block(options_.initial_block_size, NULL);
    SerialArena* serial =
        SerialArena::New(initial_block_, &thread_cache(), this);
    serial->set_next(NULL);
    threads_.store(serial, std::memory_order_relaxed);
    space_allocated_.store(options_.initial_block_size,
                           std::memory_order_relaxed);
    CacheSerialArena(serial);
  } else {
    space_allocated_.store(0, std::memory_order_relaxed);
  }
}